

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String testing::internal::AppendUserMessage(String *gtest_msg,Message *user_msg)

{
  bool bVar1;
  String *val;
  size_t extraout_RDX;
  Message *in_RDI;
  String SVar2;
  Message msg;
  String user_msg_string;
  String *in_stack_ffffffffffffff88;
  String *in_stack_ffffffffffffff90;
  String *in_stack_ffffffffffffff98;
  Message *this;
  Message *in_stack_ffffffffffffffc0;
  
  this = in_RDI;
  Message::GetString((Message *)in_stack_ffffffffffffff98);
  bVar1 = String::empty(in_stack_ffffffffffffff90);
  if (bVar1) {
    String::String(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else {
    Message::Message(in_stack_ffffffffffffffc0);
    val = (String *)Message::operator<<(this,in_stack_ffffffffffffff98);
    in_stack_ffffffffffffff90 = (String *)Message::operator<<(this,(char (*) [2])val);
    Message::operator<<(this,val);
    Message::GetString((Message *)val);
    Message::~Message((Message *)0x1e784d);
  }
  String::~String(in_stack_ffffffffffffff90);
  SVar2.length_ = extraout_RDX;
  SVar2.c_str_ = (char *)in_RDI;
  return SVar2;
}

Assistant:

String AppendUserMessage(const String& gtest_msg,
                         const Message& user_msg) {
  // Appends the user message if it's non-empty.
  const String user_msg_string = user_msg.GetString();
  if (user_msg_string.empty()) {
    return gtest_msg;
  }

  Message msg;
  msg << gtest_msg << "\n" << user_msg_string;

  return msg.GetString();
}